

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O2

bool __thiscall
draco::RAnsDecoder<12>::rans_build_look_up_table
          (RAnsDecoder<12> *this,uint32_t *token_probs,uint32_t num_symbols)

{
  pointer prVar1;
  pointer puVar2;
  uint32_t i;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->lut_table_,0x1000);
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize
            (&this->probability_table_,(ulong)num_symbols);
  prVar1 = (this->probability_table_).
           super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar3 = 0;
  while( true ) {
    uVar4 = (uint32_t)uVar5;
    if (uVar3 == num_symbols) {
      return uVar4 == 0x1000;
    }
    prVar1[uVar3].prob = token_probs[uVar3];
    prVar1[uVar3].cum_prob = uVar4;
    uVar6 = token_probs[uVar3] + uVar4;
    if (0x1000 < uVar6) break;
    puVar2 = (this->lut_table_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (; uVar5 < uVar6; uVar5 = uVar5 + 1) {
      puVar2[uVar5] = uVar3;
    }
    uVar3 = uVar3 + 1;
    uVar5 = (ulong)uVar6;
  }
  return false;
}

Assistant:

inline bool rans_build_look_up_table(const uint32_t token_probs[],
                                       uint32_t num_symbols) {
    lut_table_.resize(rans_precision);
    probability_table_.resize(num_symbols);
    uint32_t cum_prob = 0;
    uint32_t act_prob = 0;
    for (uint32_t i = 0; i < num_symbols; ++i) {
      probability_table_[i].prob = token_probs[i];
      probability_table_[i].cum_prob = cum_prob;
      cum_prob += token_probs[i];
      if (cum_prob > rans_precision) {
        return false;
      }
      for (uint32_t j = act_prob; j < cum_prob; ++j) {
        lut_table_[j] = i;
      }
      act_prob = cum_prob;
    }
    if (cum_prob != rans_precision) {
      return false;
    }
    return true;
  }